

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

int mbedtls_base64_decode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  uchar *puVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  
  if (slen == 0) {
    sVar7 = 0;
  }
  else {
    uVar4 = 0;
    uVar11 = 0;
    sVar10 = 0;
    do {
      uVar3 = sVar10 + 1;
      if (sVar10 + 1 < slen) {
        uVar3 = slen;
      }
      lVar12 = 0;
      do {
        if (src[lVar12 + sVar10] != ' ') {
          uVar3 = sVar10 + lVar12;
          break;
        }
        lVar12 = lVar12 + 1;
      } while (uVar3 - sVar10 != lVar12);
      sVar10 = slen;
      if (slen == uVar3) break;
      bVar1 = src[uVar3];
      uVar6 = (ulong)bVar1;
      if (bVar1 == 0xd && 1 < slen - uVar3) {
        if (src[uVar3 + 1] != '\n') {
          uVar6 = 0xd;
          if ((int)lVar12 != 0) {
            return -0x2c;
          }
LAB_0012c6b5:
          if ("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
              [uVar6] == 0x7f) {
            return -0x2c;
          }
          if ("\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
              [uVar6] < 0x40 && uVar4 != 0) {
            return -0x2c;
          }
          uVar11 = uVar11 + 1;
        }
      }
      else if (bVar1 != 10) {
        if ((int)lVar12 != 0) {
          return -0x2c;
        }
        if (bVar1 == 0x3d) {
          if (1 < uVar4) {
            return -0x2c;
          }
          uVar4 = uVar4 + 1;
          uVar6 = 0x3d;
        }
        else if ((char)bVar1 < '\0') {
          return -0x2c;
        }
        goto LAB_0012c6b5;
      }
      sVar10 = uVar3 + 1;
    } while (sVar10 < slen);
    iVar2 = 0;
    if (uVar11 == 0) {
      sVar7 = 0;
      goto LAB_0012c80d;
    }
    sVar7 = (ulong)(((uint)uVar11 & 7) * 6 + 7 >> 3) +
            ((uVar11 >> 2 & 0xfffffffffffffffe) * 3 - (ulong)uVar4);
    iVar2 = -0x2a;
    if ((dst == (uchar *)0x0) || (dlen < sVar7)) goto LAB_0012c80d;
    puVar8 = dst;
    if (sVar10 != 0) {
      uVar9 = 3;
      sVar7 = 0;
      uVar4 = 0;
      lVar12 = 0;
      do {
        uVar11 = (ulong)src[sVar7];
        if ((0x20 < uVar11) || ((0x100002400U >> (uVar11 & 0x3f) & 1) == 0)) {
          uVar9 = uVar9 - (uVar11 == 0x3d);
          uVar5 = uVar4 << 6;
          uVar4 = "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f>\x7f\x7f\x7f?456789:;<=\x7f\x7f\x7f@\x7f\x7f\x7f"
                  [uVar11] & 0x3f | uVar5;
          lVar12 = lVar12 + 1;
          if (lVar12 == 4) {
            if (uVar9 == 0) {
              lVar12 = 0;
              uVar9 = 0;
            }
            else {
              *puVar8 = (uchar)(uVar5 >> 0x10);
              if (uVar9 == 1) {
                puVar8 = puVar8 + 1;
                uVar9 = 1;
              }
              else {
                puVar8[1] = (uchar)(uVar5 >> 8);
                if (uVar9 < 3) {
                  puVar8 = puVar8 + 2;
                  uVar9 = 2;
                }
                else {
                  puVar8[2] = (uchar)uVar4;
                  puVar8 = puVar8 + 3;
                }
              }
              lVar12 = 0;
            }
          }
        }
        sVar7 = sVar7 + 1;
      } while (sVar10 != sVar7);
    }
    sVar7 = (long)puVar8 - (long)dst;
  }
  iVar2 = 0;
LAB_0012c80d:
  *olen = sVar7;
  return iVar2;
}

Assistant:

int mbedtls_base64_decode( unsigned char *dst, size_t dlen, size_t *olen,
                   const unsigned char *src, size_t slen )
{
    size_t i, n;
    uint32_t j, x;
    unsigned char *p;

    /* First pass: check for validity and get output length */
    for( i = n = j = 0; i < slen; i++ )
    {
        /* Skip spaces before checking for EOL */
        x = 0;
        while( i < slen && src[i] == ' ' )
        {
            ++i;
            ++x;
        }

        /* Spaces at end of buffer are OK */
        if( i == slen )
            break;

        if( ( slen - i ) >= 2 &&
            src[i] == '\r' && src[i + 1] == '\n' )
            continue;

        if( src[i] == '\n' )
            continue;

        /* Space inside a line is an error */
        if( x != 0 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( src[i] == '=' && ++j > 2 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( src[i] > 127 || base64_dec_map[src[i]] == 127 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        if( base64_dec_map[src[i]] < 64 && j != 0 )
            return( MBEDTLS_ERR_BASE64_INVALID_CHARACTER );

        n++;
    }

    if( n == 0 )
    {
        *olen = 0;
        return( 0 );
    }

    /* The following expression is to calculate the following formula without
     * risk of integer overflow in n:
     *     n = ( ( n * 6 ) + 7 ) >> 3;
     */
    n = ( 6 * ( n >> 3 ) ) + ( ( 6 * ( n & 0x7 ) + 7 ) >> 3 );
    n -= j;

    if( dst == NULL || dlen < n )
    {
        *olen = n;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

   for( j = 3, n = x = 0, p = dst; i > 0; i--, src++ )
   {
        if( *src == '\r' || *src == '\n' || *src == ' ' )
            continue;

        j -= ( base64_dec_map[*src] == 64 );
        x  = ( x << 6 ) | ( base64_dec_map[*src] & 0x3F );

        if( ++n == 4 )
        {
            n = 0;
            if( j > 0 ) *p++ = (unsigned char)( x >> 16 );
            if( j > 1 ) *p++ = (unsigned char)( x >>  8 );
            if( j > 2 ) *p++ = (unsigned char)( x       );
        }
    }

    *olen = p - dst;

    return( 0 );
}